

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_448ecb::NodeArray::printWithComma(NodeArray *this,OutputStream *S)

{
  size_t sVar1;
  char *pcVar2;
  size_t sVar3;
  Node *pNVar4;
  bool bVar5;
  size_t sVar6;
  
  if (this->NumElements != 0) {
    bVar5 = true;
    sVar6 = 0;
    do {
      sVar1 = S->CurrentPosition;
      if (!bVar5) {
        OutputStream::grow(S,2);
        pcVar2 = S->Buffer;
        sVar3 = S->CurrentPosition;
        (pcVar2 + sVar3)[0] = ',';
        (pcVar2 + sVar3)[1] = ' ';
        S->CurrentPosition = S->CurrentPosition + 2;
      }
      sVar3 = S->CurrentPosition;
      pNVar4 = this->Elements[sVar6];
      (*pNVar4->_vptr_Node[4])(pNVar4,S);
      if (pNVar4->RHSComponentCache != No) {
        (*pNVar4->_vptr_Node[5])(pNVar4,S);
      }
      if (sVar3 == S->CurrentPosition) {
        S->CurrentPosition = sVar1;
      }
      else {
        bVar5 = false;
      }
      sVar6 = sVar6 + 1;
    } while (sVar6 != this->NumElements);
  }
  return;
}

Assistant:

void printWithComma(OutputStream &S) const {
    bool FirstElement = true;
    for (size_t Idx = 0; Idx != NumElements; ++Idx) {
      size_t BeforeComma = S.getCurrentPosition();
      if (!FirstElement)
        S += ", ";
      size_t AfterComma = S.getCurrentPosition();
      Elements[Idx]->print(S);

      // Elements[Idx] is an empty parameter pack expansion, we should erase the
      // comma we just printed.
      if (AfterComma == S.getCurrentPosition()) {
        S.setCurrentPosition(BeforeComma);
        continue;
      }

      FirstElement = false;
    }
  }